

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O3

void __thiscall
cmOSXBundleGenerator::cmOSXBundleGenerator
          (cmOSXBundleGenerator *this,cmGeneratorTarget *target,string *configName)

{
  pointer pcVar1;
  cmLocalGenerator *pcVar2;
  
  this->GT = target;
  this->Makefile = target->Target->Makefile;
  pcVar2 = cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = pcVar2;
  (this->ConfigName)._M_dataplus._M_p = (pointer)&(this->ConfigName).field_2;
  pcVar1 = (configName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ConfigName,pcVar1,pcVar1 + configName->_M_string_length);
  this->MacContentFolders =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  cmTarget::HaveWellDefinedOutputFiles(this->GT->Target);
  return;
}

Assistant:

cmOSXBundleGenerator::
cmOSXBundleGenerator(cmGeneratorTarget* target,
                     const std::string& configName)
 : GT(target)
 , Makefile(target->Target->GetMakefile())
 , LocalGenerator(target->GetLocalGenerator())
 , ConfigName(configName)
 , MacContentFolders(0)
{
  if (this->MustSkip())
    return;

}